

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O0

void __thiscall Shell::PredicateDefinition::count(PredicateDefinition *this,Clause *cl,int add)

{
  uint uVar1;
  uint uVar2;
  Literal **ppLVar3;
  PredicateDefinition *pdObj;
  int in_EDX;
  Clause *in_RSI;
  Unit *in_RDI;
  int pred;
  Literal *l;
  uint i;
  uint clen;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_1c;
  
  uVar1 = Kernel::Clause::length(in_RSI);
  for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
    ppLVar3 = Kernel::Clause::operator[](in_RSI,local_1c);
    uVar2 = Kernel::Term::functor(&(*ppLVar3)->super_Term);
    pdObj = (PredicateDefinition *)
            (*(long *)&(in_RDI->_inference).field_0x8 + (long)(int)uVar2 * 0x48);
    Kernel::Literal::isPositive((Literal *)0xcd794a);
    PredData::add((PredData *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),(int)((ulong)in_RDI >> 0x20)
                  ,(int)in_RDI,pdObj);
    if (in_EDX == 1) {
      Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::insert
                ((Set<Kernel::Unit_*,_Lib::DefaultHash> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                 in_RDI);
    }
  }
  return;
}

Assistant:

void PredicateDefinition::count (Clause* cl, int add)
{
  unsigned clen=cl->length();
  for(unsigned i=0;i<clen;i++) {
    Literal* l=(*cl)[i];
    int pred = l->functor();
    _preds[pred].add(l->isPositive() ? 1 : -1, add, this);
    if(add==1) {
	_preds[pred].containingUnits.insert(cl);
    }
  }
}